

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O3

bool __thiscall
ON_CurveProxy::Split(ON_CurveProxy *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  ON_Curve *real_curve;
  bool bVar1;
  bool bVar2;
  ON_CurveProxy *pOVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double t1;
  ON_Interval right_real_dom;
  ON_Interval left_real_dom;
  ON_Interval right_this_dom;
  ON_Interval left_this_dom;
  ON_Interval d;
  ON_CurveProxy *local_98;
  ON_Interval local_88;
  ON_Interval local_78;
  ON_CurveProxy *local_68;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  this_00 = &this->m_this_domain;
  bVar1 = ON_Interval::IsIncreasing(this_00);
  if (bVar1) {
    this_01 = &this->m_real_curve_domain;
    bVar1 = ON_Interval::IsIncreasing(this_01);
    if ((bVar1) && (bVar1 = ON_Interval::Includes(this_00,t,true), bVar1)) {
      dVar5 = RealCurveParameter(this,t);
      bVar1 = ON_Interval::Includes(this_01,dVar5,true);
      if (((bVar1) &&
          ((local_98 = (ON_CurveProxy *)*left_side, local_98 == (ON_CurveProxy *)0x0 ||
           (bVar1 = ON_Object::IsKindOf((ON_Object *)local_98,&m_ON_CurveProxy_class_rtti), bVar1)))
          ) && ((pOVar3 = (ON_CurveProxy *)*right_side, pOVar3 == (ON_CurveProxy *)0x0 ||
                ((bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar3,&m_ON_CurveProxy_class_rtti),
                 bVar1 && (*right_side != *left_side)))))) {
        bVar1 = this->m_bReversed;
        local_68 = pOVar3;
        ON_Interval::ON_Interval(&local_78);
        ON_Interval::ON_Interval(&local_88);
        if (bVar1 == true) {
          dVar6 = ON_Interval::operator[](this_01,1);
          ON_Interval::Set(&local_78,dVar5,dVar6);
          dVar6 = ON_Interval::operator[](this_01,0);
          t1 = dVar5;
        }
        else {
          dVar6 = ON_Interval::operator[](this_01,0);
          ON_Interval::Set(&local_78,dVar6,dVar5);
          t1 = ON_Interval::operator[](this_01,1);
          dVar6 = dVar5;
        }
        ON_Interval::Set(&local_88,dVar6,t1);
        dVar5 = ON_Interval::operator[](this_00,0);
        ON_Interval::ON_Interval(&local_50,dVar5,t);
        dVar5 = ON_Interval::operator[](this_00,1);
        ON_Interval::ON_Interval(&local_60,t,dVar5);
        bVar2 = ON_Interval::IsIncreasing(&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = ON_Interval::IsIncreasing(&local_88);
        if (((bVar2) && (bVar2 = ON_Interval::IsIncreasing(&local_50), bVar2)) &&
           (bVar2 = ON_Interval::IsIncreasing(&local_60), bVar2)) {
          real_curve = this->m_real_curve;
          if (real_curve != (ON_Curve *)0x0) {
            (*(real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(real_curve);
            local_40.m_t[1] = dVar5;
            bVar2 = ON_Interval::Includes(&local_40,&local_78,false);
            if (!bVar2) {
              return false;
            }
            bVar2 = ON_Interval::Includes(&local_40,&local_88,false);
            if (!bVar2) {
              return false;
            }
          }
          if (local_98 == (ON_CurveProxy *)0x0) {
            local_98 = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(local_98);
          }
          pOVar3 = local_68;
          if (local_68 == (ON_CurveProxy *)0x0) {
            pOVar3 = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(pOVar3);
          }
          SetProxyCurve(local_98,real_curve,local_78);
          SetProxyCurve(pOVar3,real_curve,local_88);
          if (bVar1 != false) {
            (*(local_98->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])();
            (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      (pOVar3);
          }
          pdVar4 = ON_Interval::operator[](&local_50,0);
          dVar5 = *pdVar4;
          pdVar4 = ON_Interval::operator[](&local_50,1);
          (*(local_98->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar5,*pdVar4);
          pdVar4 = ON_Interval::operator[](&local_60,0);
          dVar5 = *pdVar4;
          pdVar4 = ON_Interval::operator[](&local_60,1);
          (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar5,*pdVar4,pOVar3);
          if (*left_side == (ON_Curve *)0x0) {
            *left_side = &local_98->super_ON_Curve;
          }
          if (*right_side == (ON_Curve *)0x0) {
            *right_side = &pOVar3->super_ON_Curve;
            return true;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_CurveProxy::Split(
    double t,
    ON_Curve*& left_side,
    ON_Curve*& right_side
  ) const
{
  bool rc = false;
  if ( m_this_domain.IsIncreasing() && m_real_curve_domain.IsIncreasing() && m_this_domain.Includes(t,true) )
  {
    double crv_t = RealCurveParameter(t);
    if ( m_real_curve_domain.Includes(crv_t,true) )
    {
      ON_CurveProxy* left_proxy = 0;
      ON_CurveProxy* right_proxy = 0;
      if ( left_side )
      {
        left_proxy = ON_CurveProxy::Cast(left_side);
        if ( !left_proxy )
          return false;
      }
      if ( right_side )
      {
        right_proxy = ON_CurveProxy::Cast(right_side);
        if ( !right_proxy )
          return false;
        if ( right_side == left_side )
          return false;
      }

      bool bRev = m_bReversed;

      ON_Interval left_real_dom, right_real_dom;
      if ( bRev )
      {
        left_real_dom.Set(crv_t,m_real_curve_domain[1]);
        right_real_dom.Set(m_real_curve_domain[0],crv_t);
      }
      else
      {
        left_real_dom.Set(m_real_curve_domain[0],crv_t);
        right_real_dom.Set(crv_t,m_real_curve_domain[1]);
      }

      ON_Interval left_this_dom(m_this_domain[0],t);
      ON_Interval right_this_dom(t,m_this_domain[1]);

      if (    left_real_dom.IsIncreasing() 
           && right_real_dom.IsIncreasing()
           && left_this_dom.IsIncreasing()
           && right_this_dom.IsIncreasing()
           )
      {
        // note well that left_proxy or right_proxy might also be this
        const ON_Curve* real_crv = m_real_curve;
        if ( real_crv )
        {
          ON_Interval d = real_crv->Domain();
          if ( !d.Includes(left_real_dom) )
            return false;
          if ( !d.Includes(right_real_dom) )
            return false;
        }

        if ( !left_proxy )
          left_proxy = new ON_CurveProxy();
        if ( !right_proxy )
          right_proxy = new ON_CurveProxy();

        left_proxy->SetProxyCurve( real_crv, left_real_dom );
        right_proxy->SetProxyCurve( real_crv, right_real_dom );

        if ( bRev )
        {
          left_proxy->Reverse();
          right_proxy->Reverse();
        }

        left_proxy->SetDomain(left_this_dom[0],left_this_dom[1]);
        right_proxy->SetDomain(right_this_dom[0],right_this_dom[1]);

        if (!left_side) left_side = left_proxy;
        if (!right_side) right_side = right_proxy;

        rc = true;
      }
    }
  }
  return rc;
}